

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.h
# Opt level: O0

bool __thiscall
imrt::MagnitudeCompare::operator()
          (MagnitudeCompare *this,pair<double,_std::pair<int,_int>_> *lhs,
          pair<double,_std::pair<int,_int>_> *rhs)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  
  std::abs(in_EDI);
  std::abs(in_EDI);
  if (extraout_XMM0_Qa_00 < extraout_XMM0_Qa) {
    return true;
  }
  std::abs(in_EDI);
  std::abs(in_EDI);
  if ((extraout_XMM0_Qa_01 == extraout_XMM0_Qa_02) &&
     (!NAN(extraout_XMM0_Qa_01) && !NAN(extraout_XMM0_Qa_02))) {
    if (*(int *)(in_RSI + 8) < *(int *)(in_RDX + 8)) {
      return true;
    }
    if ((*(int *)(in_RSI + 8) == *(int *)(in_RDX + 8)) &&
       (*(int *)(in_RSI + 0xc) < *(int *)(in_RDX + 0xc))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool operator()(const pair< double, pair<int,int> >& lhs, const pair< double, pair<int,int> >& rhs)
     {
    	 if(abs(lhs.first) > abs(rhs.first)) return true;
    	 if(abs(lhs.first) == abs(rhs.first)){
    		 //if(pair_hash()(lhs.second)< pair_hash()(rhs.second)) return true;
    		 if(lhs.second.first < rhs.second.first) return true;
    		 if(lhs.second.first == rhs.second.first &&  lhs.second.second < rhs.second.second) return true;
    	 }
         return false;
     }